

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_test.cpp
# Opt level: O1

void flatbuffers::tests::RunTest
               (IDLOptions *opts,string *proto_path,string *proto_file,string *golden_file,
               string *import_proto_file)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char **ppcVar2;
  bool bVar3;
  Status SVar4;
  long *plVar5;
  size_type *psVar6;
  pointer *__ptr;
  unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
  fbs_generator;
  string imported_fbs;
  string fbs;
  string import_fbs;
  char *include_directories [2];
  Parser parser2;
  Parser import_parser;
  Parser parser;
  long *local_1778;
  string local_1770;
  string *local_1750;
  string local_1748;
  char *local_1728;
  undefined8 local_1720;
  char local_1718;
  undefined7 uStack_1717;
  char *local_1708;
  undefined8 local_1700;
  char local_16f8;
  undefined7 uStack_16f7;
  pointer local_16e8;
  undefined8 local_16e0;
  string local_16d0;
  Parser local_16b0;
  Parser local_f30;
  Parser local_7b0;
  
  local_16e8 = (proto_path->_M_dataplus)._M_p;
  local_16e0 = 0;
  local_1750 = golden_file;
  Parser::Parser(&local_7b0,opts);
  bVar3 = Parser::Parse(&local_7b0,(proto_file->_M_dataplus)._M_p,&local_16e8,(char *)0x0);
  TestEq<bool,bool>(bVar3,true,
                    "\'parser.Parse(proto_file.c_str(), include_directories)\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
                    ,0x11,"");
  NewFBSCodeGenerator((flatbuffers *)&local_1778,true);
  plVar5 = local_1778;
  local_1720 = 0;
  local_1718 = '\0';
  ppcVar2 = &local_16b0.super_ParserState.line_start_;
  local_1728 = &local_1718;
  local_16b0.super_ParserState.prev_cursor_ = (char *)ppcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_16b0,"test","");
  SVar4 = (**(code **)(*plVar5 + 0x18))(plVar5,&local_7b0,&local_16b0,&local_1728);
  TestEq<flatbuffers::CodeGenerator::Status,flatbuffers::CodeGenerator::Status>
            (SVar4,OK,
             "\'fbs_generator->GenerateCodeString(parser, \"test\", fbs)\' != \'CodeGenerator::Status::OK\'"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
             ,0x17,"");
  if ((char **)local_16b0.super_ParserState.prev_cursor_ != ppcVar2) {
    operator_delete(local_16b0.super_ParserState.prev_cursor_,
                    (ulong)(local_16b0.super_ParserState.line_start_ + 1));
  }
  IDLOptions::IDLOptions((IDLOptions *)&local_f30);
  Parser::Parser(&local_16b0,(IDLOptions *)&local_f30);
  IDLOptions::~IDLOptions((IDLOptions *)&local_f30);
  if (import_proto_file->_M_string_length != 0) {
    Parser::Parser(&local_f30,opts);
    bVar3 = Parser::Parse(&local_f30,(import_proto_file->_M_dataplus)._M_p,&local_16e8,(char *)0x0);
    TestEq<bool,bool>(bVar3,true,
                      "\'import_parser.Parse(import_proto_file.c_str(), include_directories)\' != \'true\'"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
                      ,0x20,"");
    plVar5 = local_1778;
    local_1700 = 0;
    local_16f8 = '\0';
    paVar1 = &local_1770.field_2;
    local_1770._M_dataplus._M_p = (pointer)paVar1;
    local_1708 = &local_16f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1770,"test","");
    SVar4 = (**(code **)(*plVar5 + 0x18))(plVar5,&local_f30,&local_1770,&local_1708);
    TestEq<flatbuffers::CodeGenerator::Status,flatbuffers::CodeGenerator::Status>
              (SVar4,OK,
               "\'fbs_generator->GenerateCodeString(import_parser, \"test\", import_fbs)\' != \'CodeGenerator::Status::OK\'"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
               ,0x24,"");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1770._M_dataplus._M_p != paVar1) {
      operator_delete(local_1770._M_dataplus._M_p,local_1770.field_2._M_allocated_capacity + 1);
    }
    AbsolutePath(&local_16d0,proto_path);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_16d0);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_1748.field_2._M_allocated_capacity = *psVar6;
      local_1748.field_2._8_8_ = plVar5[3];
      local_1748._M_dataplus._M_p = (pointer)&local_1748.field_2;
    }
    else {
      local_1748.field_2._M_allocated_capacity = *psVar6;
      local_1748._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_1748._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    PosixPath(&local_1770,&local_1748);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1748._M_dataplus._M_p != &local_1748.field_2) {
      operator_delete(local_1748._M_dataplus._M_p,local_1748.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_16d0._M_dataplus._M_p != &local_16d0.field_2) {
      operator_delete(local_16d0._M_dataplus._M_p,local_16d0.field_2._M_allocated_capacity + 1);
    }
    bVar3 = Parser::Parse(&local_16b0,local_1708,&local_16e8,local_1770._M_dataplus._M_p);
    TestEq<bool,bool>(bVar3,true,
                      "\'parser2.Parse(import_fbs.c_str(), include_directories, imported_fbs.c_str())\' != \'true\'"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
                      ,0x2c,"");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1770._M_dataplus._M_p != paVar1) {
      operator_delete(local_1770._M_dataplus._M_p,local_1770.field_2._M_allocated_capacity + 1);
    }
    if (local_1708 != &local_16f8) {
      operator_delete(local_1708,CONCAT71(uStack_16f7,local_16f8) + 1);
    }
    Parser::~Parser(&local_f30);
  }
  bVar3 = Parser::Parse(&local_16b0,local_1728,(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar3,true,"\'parser2.Parse(fbs.c_str(), nullptr)\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
                    ,0x2f,"");
  TestEqStr(local_1728,(local_1750->_M_dataplus)._M_p,"\'fbs.c_str()\' != \'golden_file.c_str()\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
            ,0x30,"");
  Parser::~Parser(&local_16b0);
  if (local_1728 != &local_1718) {
    operator_delete(local_1728,CONCAT71(uStack_1717,local_1718) + 1);
  }
  if (local_1778 != (long *)0x0) {
    (**(code **)(*local_1778 + 8))();
  }
  Parser::~Parser(&local_7b0);
  return;
}

Assistant:

void RunTest(const flatbuffers::IDLOptions &opts, const std::string &proto_path,
             const std::string &proto_file, const std::string &golden_file,
             const std::string import_proto_file) {
  const char *include_directories[] = { proto_path.c_str(), nullptr };

  // Parse proto.
  flatbuffers::Parser parser(opts);
  TEST_EQ(parser.Parse(proto_file.c_str(), include_directories), true);

  // Generate fbs.
  std::unique_ptr<CodeGenerator> fbs_generator = NewFBSCodeGenerator(true);
  std::string fbs;
  TEST_EQ(fbs_generator->GenerateCodeString(parser, "test", fbs),
          CodeGenerator::Status::OK);

  // Ensure generated file is parsable.
  flatbuffers::Parser parser2;

  if (!import_proto_file.empty()) {
    // Generate fbs from import.proto
    flatbuffers::Parser import_parser(opts);
    TEST_EQ(import_parser.Parse(import_proto_file.c_str(), include_directories),
            true);
    std::string import_fbs;
    TEST_EQ(
        fbs_generator->GenerateCodeString(import_parser, "test", import_fbs),
        CodeGenerator::Status::OK);
    // auto import_fbs = flatbuffers::GenerateFBS(import_parser, "test", true);
    // Since `imported.fbs` isn't in the filesystem AbsolutePath can't figure it
    // out by itself. We manually construct it so Parser works.
    std::string imported_fbs = flatbuffers::PosixPath(
        flatbuffers::AbsolutePath(proto_path) + "/imported.fbs");
    TEST_EQ(parser2.Parse(import_fbs.c_str(), include_directories,
                          imported_fbs.c_str()),
            true);
  }

  TEST_EQ(parser2.Parse(fbs.c_str(), nullptr), true);
  TEST_EQ_STR(fbs.c_str(), golden_file.c_str());
}